

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O1

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  Name *pNVar1;
  ulong uVar2;
  address64_t aVar3;
  undefined1 auVar4 [16];
  Block *pBVar5;
  Index index;
  Index index_00;
  Memory *pMVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  Store *pSVar9;
  Const *pCVar10;
  Binary *pBVar11;
  ulong extraout_RDX;
  Type in_R8;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  LocalSet *local_98;
  LocalSet *local_90;
  Block *local_88;
  Const *local_80;
  initializer_list<wasm::Expression_*> local_78;
  Name *local_60;
  ulong local_58;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_50;
  address64_t local_48;
  Builder local_40;
  Builder builder;
  
  uVar2 = (curr->align).addr;
  if (uVar2 == 0) {
    return (Expression *)curr;
  }
  if (uVar2 == curr->bytes) {
    return (Expression *)curr;
  }
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  if ((curr->value->type).id != 2) {
    __assert_fail("curr->value->type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                  ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
  }
  pNVar1 = &curr->memory;
  pMVar6 = Module::getMemory(local_40.wasm,(Name)(curr->memory).super_IString.str);
  local_58 = (pMVar6->addressType).id;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_58;
  index = Builder::addVar((Builder *)
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
  index_00 = Builder::addVar((Builder *)
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                             ).
                             super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                             .
                             super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                             .currFunction,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
  builder.wasm._4_4_ = index;
  local_98 = Builder::makeLocalSet(&local_40,index,curr->ptr);
  builder.wasm._0_4_ = index_00;
  local_90 = Builder::makeLocalSet(&local_40,index_00,curr->value);
  local_78._M_len = 2;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  local_78._M_array = (iterator)&local_98;
  local_88 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_40,&local_78,type);
  local_60 = pNVar1;
  if (curr->bytes == '\x04') {
    aVar3 = (curr->align).addr;
    if (aVar3 == 2) {
      local_50 = &(local_88->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
      local_48 = (curr->offset).addr;
      pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar7->_id = LocalGetId;
      *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
      (pEVar7->type).id = local_58;
      pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar8->_id = LocalGetId;
      *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
      (pEVar8->type).id = 2;
      local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
      local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
      pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
      *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      (pSVar9->align).addr = 0;
      *(undefined8 *)&pSVar9->isAtomic = 0;
      *(undefined8 *)&pSVar9->bytes = 0;
      (pSVar9->offset).addr = 0;
      pSVar9->ptr = (Expression *)0x0;
      pSVar9->value = (Expression *)0x0;
      (pSVar9->valueType).id = 0;
      (pSVar9->memory).super_IString.str._M_len = 0;
      (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      (pSVar9->offset).addr = 0;
      (pSVar9->align).addr = 0;
      pSVar9->isAtomic = false;
      pSVar9->bytes = '\x02';
      (pSVar9->offset).addr = local_48;
      (pSVar9->align).addr = 2;
      pSVar9->ptr = pEVar7;
      pSVar9->value = pEVar8;
      (pSVar9->valueType).id = 2;
      (pSVar9->memory).super_IString.str._M_len = (size_t)local_78._M_array;
      (pSVar9->memory).super_IString.str._M_str = (char *)local_78._M_len;
      Store::finalize(pSVar9);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_50,(Expression *)pSVar9);
      local_48 = (curr->offset).addr + 2;
      pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar7->_id = LocalGetId;
      *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
      (pEVar7->type).id = local_58;
      pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar8->_id = LocalGetId;
      *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
      (pEVar8->type).id = 2;
      pCVar10 = Builder::makeConst<int>(&local_40,0x10);
      pBVar11 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar11->op = ShrUInt32;
      pBVar11->left = pEVar8;
      pBVar11->right = (Expression *)pCVar10;
      Binary::finalize(pBVar11);
      local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
      local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
      pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
      *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      (pSVar9->align).addr = 0;
      *(undefined8 *)&pSVar9->isAtomic = 0;
      *(undefined8 *)&pSVar9->bytes = 0;
      (pSVar9->offset).addr = 0;
      pSVar9->ptr = (Expression *)0x0;
      pSVar9->value = (Expression *)0x0;
      (pSVar9->valueType).id = 0;
      (pSVar9->memory).super_IString.str._M_len = 0;
      (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      (pSVar9->offset).addr = 0;
      (pSVar9->align).addr = 0;
      pSVar9->isAtomic = false;
      pSVar9->bytes = '\x02';
      (pSVar9->offset).addr = local_48;
      (pSVar9->align).addr = 2;
      pSVar9->ptr = pEVar7;
      pSVar9->value = (Expression *)pBVar11;
      goto LAB_007ab413;
    }
    if (aVar3 != 1) {
      handle_unreachable("invalid alignment",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                         ,0xe9);
    }
    local_50 = &(local_88->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    local_48 = (curr->offset).addr;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
    (pEVar7->type).id = local_58;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
    (pEVar8->type).id = 2;
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    pSVar9->ptr = (Expression *)0x0;
    pSVar9->value = (Expression *)0x0;
    (pSVar9->valueType).id = 0;
    (pSVar9->memory).super_IString.str._M_len = 0;
    (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    pSVar9->isAtomic = false;
    pSVar9->bytes = '\x01';
    (pSVar9->offset).addr = local_48;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = pEVar7;
    pSVar9->value = pEVar8;
    (pSVar9->valueType).id = 2;
    (pSVar9->memory).super_IString.str._M_len = (size_t)local_78._M_array;
    (pSVar9->memory).super_IString.str._M_str = (char *)local_78._M_len;
    Store::finalize(pSVar9);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_50,(Expression *)pSVar9);
    local_48 = (curr->offset).addr + 1;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
    (pEVar7->type).id = local_58;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
    (pEVar8->type).id = 2;
    local_80 = Builder::makeConst<int>(&local_40,8);
    pBVar11 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar11->op = ShrUInt32;
    pBVar11->left = pEVar8;
    pBVar11->right = (Expression *)local_80;
    Binary::finalize(pBVar11);
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    pSVar9->ptr = (Expression *)0x0;
    pSVar9->value = (Expression *)0x0;
    (pSVar9->valueType).id = 0;
    (pSVar9->memory).super_IString.str._M_len = 0;
    (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    pSVar9->isAtomic = false;
    pSVar9->bytes = '\x01';
    (pSVar9->offset).addr = local_48;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = pEVar7;
    pSVar9->value = (Expression *)pBVar11;
    (pSVar9->valueType).id = 2;
    (pSVar9->memory).super_IString.str._M_len = (size_t)local_78._M_array;
    (pSVar9->memory).super_IString.str._M_str = (char *)local_78._M_len;
    Store::finalize(pSVar9);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_50,(Expression *)pSVar9);
    local_48 = (curr->offset).addr + 2;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
    (pEVar7->type).id = local_58;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
    (pEVar8->type).id = 2;
    local_80 = Builder::makeConst<int>(&local_40,0x10);
    pBVar11 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar11->op = ShrUInt32;
    pBVar11->left = pEVar8;
    pBVar11->right = (Expression *)local_80;
    Binary::finalize(pBVar11);
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    pSVar9->ptr = (Expression *)0x0;
    pSVar9->value = (Expression *)0x0;
    (pSVar9->valueType).id = 0;
    (pSVar9->memory).super_IString.str._M_len = 0;
    (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    pSVar9->isAtomic = false;
    pSVar9->bytes = '\x01';
    (pSVar9->offset).addr = local_48;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = pEVar7;
    pSVar9->value = (Expression *)pBVar11;
    (pSVar9->valueType).id = 2;
    (pSVar9->memory).super_IString.str._M_len = (size_t)local_78._M_array;
    (pSVar9->memory).super_IString.str._M_str = (char *)local_78._M_len;
    Store::finalize(pSVar9);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_50,(Expression *)pSVar9);
    local_48 = (curr->offset).addr + 3;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
    (pEVar7->type).id = local_58;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
    (pEVar8->type).id = 2;
    pCVar10 = Builder::makeConst<int>(&local_40,0x18);
    pBVar11 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar11->op = ShrUInt32;
    pBVar11->left = pEVar8;
    pBVar11->right = (Expression *)pCVar10;
    Binary::finalize(pBVar11);
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    pSVar9->ptr = (Expression *)0x0;
    pSVar9->value = (Expression *)0x0;
    (pSVar9->valueType).id = 0;
    (pSVar9->memory).super_IString.str._M_len = 0;
    (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    pSVar9->isAtomic = false;
    pSVar9->bytes = '\x01';
    (pSVar9->offset).addr = local_48;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = pEVar7;
  }
  else {
    if (curr->bytes != '\x02') {
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                         ,0xec);
    }
    local_50 = &(local_88->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    local_48 = (curr->offset).addr;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
    (pEVar7->type).id = local_58;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
    (pEVar8->type).id = 2;
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    pSVar9->ptr = (Expression *)0x0;
    pSVar9->value = (Expression *)0x0;
    (pSVar9->valueType).id = 0;
    (pSVar9->memory).super_IString.str._M_len = 0;
    (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    pSVar9->isAtomic = false;
    pSVar9->bytes = '\x01';
    (pSVar9->offset).addr = local_48;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = pEVar7;
    pSVar9->value = pEVar8;
    (pSVar9->valueType).id = 2;
    (pSVar9->memory).super_IString.str._M_len = (size_t)local_78._M_array;
    (pSVar9->memory).super_IString.str._M_str = (char *)local_78._M_len;
    Store::finalize(pSVar9);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_50,(Expression *)pSVar9);
    local_48 = (curr->offset).addr + 1;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = builder.wasm._4_4_;
    (pEVar7->type).id = local_58;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = (Index)builder.wasm;
    (pEVar8->type).id = 2;
    pCVar10 = Builder::makeConst<int>(&local_40,8);
    pBVar11 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar11->op = ShrUInt32;
    pBVar11->left = pEVar8;
    pBVar11->right = (Expression *)pCVar10;
    Binary::finalize(pBVar11);
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    pSVar9->ptr = (Expression *)0x0;
    pSVar9->value = (Expression *)0x0;
    (pSVar9->valueType).id = 0;
    (pSVar9->memory).super_IString.str._M_len = 0;
    (pSVar9->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    pSVar9->isAtomic = false;
    pSVar9->bytes = '\x01';
    (pSVar9->offset).addr = local_48;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = pEVar7;
  }
  pSVar9->value = (Expression *)pBVar11;
LAB_007ab413:
  (pSVar9->valueType).id = 2;
  (pSVar9->memory).super_IString.str._M_len = (size_t)local_78._M_array;
  (pSVar9->memory).super_IString.str._M_str = (char *)local_78._M_len;
  Store::finalize(pSVar9);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (local_50,(Expression *)pSVar9);
  pBVar5 = local_88;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pSVar9;
  Block::finalize(local_88,type_,Unknown);
  return (Expression *)pBVar5;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto addressType = mem->addressType;
    auto tempPtr = builder.addVar(getFunction(), addressType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, addressType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, addressType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }